

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

RcvMsg * punpack(FILE *fdes)

{
  size_t sVar1;
  char *buf_00;
  size_t n;
  RcvMsg *rmsg;
  char *buf;
  size_t nparse;
  size_t nread;
  FILE *fdes_local;
  
  n = (size_t)rcvmsg_create();
  sVar1 = get_max_msg_size();
  buf_00 = (char *)emalloc(sVar1 << 1);
  sVar1 = get_max_msg_size();
  buf = (char *)read_buf(fdes,sVar1 << 1,buf_00);
  nparse = (size_t)buf;
  while( true ) {
    if (buf == (char *)0x0) {
      free(buf_00);
      if (((RcvMsg *)n)->lastctx == CK_CTX_INVALID) {
        free((void *)n);
        n = 0;
      }
      return (RcvMsg *)n;
    }
    sVar1 = get_result(buf_00,(RcvMsg *)n);
    if ((long)((long)buf - sVar1) < 0) break;
    buf = buf + -sVar1;
    memmove(buf_00,buf_00 + sVar1,(size_t)buf);
    if (nparse != 0) {
      nparse = read_buf(fdes,sVar1,buf_00 + (long)buf);
      buf = buf + nparse;
    }
  }
  eprintf("Error in call to get_result",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x20f);
}

Assistant:

RcvMsg *punpack(FILE * fdes)
{
    size_t nread, nparse;
    char *buf;
    RcvMsg *rmsg;

    rmsg = rcvmsg_create();

    /* Allcate a buffer */
    buf = (char *)emalloc(get_max_msg_size() * 2);
    /* Fill the buffer from the file */
    nread = read_buf(fdes, get_max_msg_size() * 2, buf);
    nparse = nread;
    /* While not all parsed */
    while(nparse > 0)
    {
        /* Parse one message */
        size_t n = get_result(buf, rmsg);
        if ( ((ssize_t) nparse - (ssize_t) n) < 0)    /* casting necessary to be able to get proper negative integers */
            eprintf("Error in call to get_result", __FILE__, __LINE__ - 5);
        nparse -= n;
        /* Move remaining data in buffer to the beginning */
        memmove(buf, buf + n, nparse);
        /* If EOF has not been seen */
        if(nread > 0)
        {
            /* Read more data into empty space at end of the buffer */
            nread = read_buf(fdes, (size_t) n, buf + nparse);
            nparse += nread;
        }
    }
    free(buf);

    if(rmsg->lastctx == CK_CTX_INVALID)
    {
        free(rmsg);
        rmsg = NULL;
    }

    return rmsg;
}